

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

int zdd_group_move(DdManager *table,int x,int y,Move **moves)

{
  DdSubtable *pDVar1;
  Move *pMVar2;
  int iVar3;
  uint uVar4;
  DdNode *pDVar5;
  Move *pMVar6;
  ulong uVar7;
  DdHalfWord DVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  pDVar1 = table->subtableZ;
  uVar14 = (ulong)x;
  uVar4 = pDVar1[uVar14].next;
  uVar9 = pDVar1[y].next;
  do {
    uVar7 = (ulong)uVar9;
    uVar9 = pDVar1[(int)uVar9].next;
  } while (uVar9 != y);
  uVar12 = 0xffffffffffffffff;
  DVar8 = 0xffffffff;
  for (; (int)uVar14 <= y; uVar14 = uVar14 + 1) {
    uVar11 = (ulong)uVar4;
    uVar15 = uVar14;
    while( true ) {
      uVar9 = y;
      pDVar1 = table->subtableZ;
      if ((int)uVar9 <= (int)uVar4) break;
      uVar10 = pDVar1[uVar15].next;
      y = (int)uVar15;
      uVar12 = uVar11;
      do {
        iVar3 = (int)uVar12;
        uVar12 = (ulong)pDVar1[iVar3].next;
      } while (pDVar1[iVar3].next != y);
      if (uVar10 == y) {
        uVar10 = uVar9;
      }
      pDVar1[iVar3].next = uVar9;
      uVar13 = pDVar1[(int)uVar9].next;
      if (pDVar1[(int)uVar9].next == uVar9) {
        uVar13 = y;
      }
      pDVar1[uVar15].next = uVar13;
      uVar12 = uVar15 & 0xffffffff;
      if ((uint)uVar7 != uVar9) {
        pDVar1[(int)(uint)uVar7].next = y;
        uVar12 = uVar7;
      }
      uVar7 = uVar12;
      pDVar1[(int)uVar9].next = uVar10;
      iVar3 = cuddZddSwapInPlace(table,y,uVar9);
      uVar12 = uVar15 & 0xffffffff;
      uVar15 = uVar15 - 1;
      DVar8 = uVar9;
      if (iVar3 == 0) goto LAB_00755e47;
    }
    y = uVar9;
    if (uVar9 < pDVar1[(int)uVar9].next) {
      y = pDVar1[(int)uVar9].next;
    }
    uVar4 = uVar4 + 1;
    uVar7 = uVar11;
  }
  pDVar5 = cuddDynamicAllocNode(table);
  if (pDVar5 == (DdNode *)0x0) {
LAB_00755e47:
    pMVar6 = *moves;
    while (pMVar6 != (Move *)0x0) {
      pMVar2 = pMVar6->next;
      pMVar6->y = 0;
      *(DdNode **)&pMVar6->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar2;
      pMVar6 = pMVar2;
    }
    uVar4 = 0;
  }
  else {
    pDVar5->index = (DdHalfWord)uVar12;
    pDVar5->ref = DVar8;
    uVar4 = table->keysZ;
    *(uint *)((long)&pDVar5->next + 4) = uVar4;
    (pDVar5->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar5;
  }
  return uVar4;
}

Assistant:

static int
zdd_group_move(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move        *move;
    int         size;
    int         i, temp, gxtop, gxbot, gybot, yprev;
    int         swapx = -1, swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top and bottom for the two groups. */
    gxtop = table->subtableZ[x].next;
    gxbot = x;
    gybot = table->subtableZ[y].next;
    while (table->subtableZ[gybot].next != (unsigned) y)
        gybot = table->subtableZ[gybot].next;
    yprev = gybot;

    while (x <= y) {
        while (y > gxtop) {
            /* Set correct symmetries. */
            temp = table->subtableZ[x].next;
            if (temp == x)
                temp = y;
            i = gxtop;
            for (;;) {
                if (table->subtableZ[i].next == (unsigned) x) {
                    table->subtableZ[i].next = y;
                    break;
                } else {
                    i = table->subtableZ[i].next;
                }
            }
            if (table->subtableZ[y].next != (unsigned) y) {
                table->subtableZ[x].next = table->subtableZ[y].next;
            } else {
                table->subtableZ[x].next = x;
            }

            if (yprev != y) {
                table->subtableZ[yprev].next = x;
            } else {
                yprev = x;
            }
            table->subtableZ[y].next = temp;

            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto zdd_group_moveOutOfMem;
            swapx = x;
            swapy = y;
            y = x;
            x--;
        } /* while y > gxtop */

        /* Trying to find the next y. */
        if (table->subtableZ[y].next <= (unsigned) y) {
            gybot = y;
        } else {
            y = table->subtableZ[y].next;
        }

        yprev = gxtop;
        gxtop++;
        gxbot++;
        x = gxbot;
    } /* while x <= y, end of group movement */
    move = (Move *)cuddDynamicAllocNode(table);
    if (move == NULL)
        goto zdd_group_moveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->size = table->keysZ;
    move->next = *moves;
    *moves = move;

    return(table->keysZ);

zdd_group_moveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}